

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_parse_certificate(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  mbedtls_key_exchange_type_t mVar2;
  uint uVar3;
  uint uVar4;
  mbedtls_ssl_ciphersuite_t *ciphersuite;
  uchar *puVar5;
  size_t __n;
  mbedtls_x509_crt *pmVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  mbedtls_x509_crt *pmVar10;
  mbedtls_x509_crl **ppmVar11;
  mbedtls_ecp_group_id *pmVar12;
  ushort uVar13;
  mbedtls_ecp_group_id mVar14;
  mbedtls_ssl_config *pmVar15;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  mbedtls_ssl_session *pmVar19;
  
  ciphersuite = ssl->transform_negotiate->ciphersuite_info;
  uVar1 = *(uint *)&ssl->conf->field_0x164;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x101b,"=> parse certificate");
  mVar2 = ciphersuite->key_exchange;
  if ((mVar2 < MBEDTLS_KEY_EXCHANGE_ECDH_RSA) && ((0x160U >> (mVar2 & 0x1f) & 1) != 0)) {
    iVar7 = 0x1021;
LAB_0016fe82:
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,iVar7,"<= skip parse certificate");
    ssl->state = ssl->state + 1;
    return 0;
  }
  uVar3 = *(uint *)&ssl->conf->field_0x164;
  if (mVar2 == MBEDTLS_KEY_EXCHANGE_RSA_PSK && (uVar3 & 1) != 0) {
    iVar7 = 0x102a;
    goto LAB_0016fe82;
  }
  uVar4 = ssl->handshake->sni_authmode;
  uVar1 = uVar1 >> 2 & 3;
  if (uVar4 != 3) {
    uVar1 = uVar4;
  }
  if (((uVar3 & 1) != 0) && (uVar1 == 0)) {
    ssl->session_negotiate->verify_result = 0x80;
    iVar7 = 0x1038;
    goto LAB_0016fe82;
  }
  iVar7 = mbedtls_ssl_read_record(ssl);
  if (iVar7 != 0) {
    pcVar16 = "mbedtls_ssl_read_record";
    iVar8 = 0x1040;
LAB_0016ff50:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,iVar8,pcVar16,iVar7);
    return iVar7;
  }
  ssl->state = ssl->state + 1;
  uVar3 = *(uint *)&ssl->conf->field_0x164;
  if ((uVar3 & 1) != 0) {
    if (ssl->minor_ver == 0) {
      if ((((ssl->in_msglen == 2) && (ssl->in_msgtype == 0x15)) && (*ssl->in_msg == '\x01')) &&
         (ssl->in_msg[1] == ')')) {
        pcVar16 = "SSLv3 client has no certificate";
        iVar7 = 0x1053;
        goto LAB_00170025;
      }
    }
    else {
      uVar9 = (ulong)((uVar3 & 2) << 2);
      if (((ssl->in_hslen == uVar9 + 7) && (ssl->in_msgtype == 0x16)) &&
         ((puVar5 = ssl->in_msg, *puVar5 == '\v' &&
          (uVar9 = uVar9 | 4, puVar5[uVar9 + 2] == '\0' && *(short *)(puVar5 + uVar9) == 0)))) {
        pcVar16 = "TLSv1 client has no certificate";
        iVar7 = 0x1068;
LAB_00170025:
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,iVar7,pcVar16);
        ssl->session_negotiate->verify_result = 0x40;
        if (uVar1 != 1) {
          return -0x7480;
        }
        return 0;
      }
    }
  }
  if (ssl->in_msgtype != 0x16) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x1077,"bad certificate message");
    return -0x7700;
  }
  puVar5 = ssl->in_msg;
  if (*puVar5 == '\v') {
    uVar9 = (ulong)((uVar3 & 2) << 2);
    if (uVar9 + 10 <= ssl->in_hslen) {
      uVar17 = uVar9 | 4;
      if ((puVar5[uVar17] == '\0') &&
         (ssl->in_hslen ==
          (ushort)(*(ushort *)(puVar5 + uVar17 + 1) << 8 | *(ushort *)(puVar5 + uVar17 + 1) >> 8) +
          uVar17 + 3)) {
        pmVar19 = ssl->session_negotiate;
        if (pmVar19->peer_cert != (mbedtls_x509_crt *)0x0) {
          mbedtls_x509_crt_free(pmVar19->peer_cert);
          free(ssl->session_negotiate->peer_cert);
          pmVar19 = ssl->session_negotiate;
        }
        pmVar10 = (mbedtls_x509_crt *)calloc(1,0x228);
        pmVar19->peer_cert = pmVar10;
        if (pmVar10 == (mbedtls_x509_crt *)0x0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0x109b,"alloc(%d bytes) failed",0x228);
          return -0x7f00;
        }
        uVar9 = uVar9 | 7;
        mbedtls_x509_crt_init(pmVar10);
        do {
          if (ssl->in_hslen <= uVar9) {
            mbedtls_debug_print_crt
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0x10c0,"peer certificate",ssl->session_negotiate->peer_cert);
            pmVar15 = ssl->conf;
            if (((pmVar15->field_0x164 & 1) == 0) && (ssl->renego_status == 1)) {
              pmVar10 = ssl->session->peer_cert;
              if (pmVar10 == (mbedtls_x509_crt *)0x0) {
                pcVar16 = "new server cert during renegotiation";
                iVar7 = 0x10cc;
                goto LAB_001701dc;
              }
              __n = (pmVar10->raw).len;
              pmVar6 = ssl->session_negotiate->peer_cert;
              if ((__n != (pmVar6->raw).len) ||
                 (iVar7 = bcmp((pmVar10->raw).p,(pmVar6->raw).p,__n), iVar7 != 0)) {
                pcVar16 = "server cert changed during renegotiation";
                iVar7 = 0x10d6;
                goto LAB_001701dc;
              }
            }
            if (uVar1 == 0) {
              iVar7 = 0;
              goto LAB_00170453;
            }
            pmVar10 = ssl->handshake->sni_ca_chain;
            if (pmVar10 == (mbedtls_x509_crt *)0x0) {
              pmVar10 = pmVar15->ca_chain;
              if (pmVar10 == (mbedtls_x509_crt *)0x0) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                           ,0x10f0,"got no CA chain");
                return -0x7680;
              }
              ppmVar11 = &pmVar15->ca_crl;
            }
            else {
              ppmVar11 = &ssl->handshake->sni_ca_crl;
            }
            iVar8 = mbedtls_x509_crt_verify_with_profile
                              (ssl->session_negotiate->peer_cert,pmVar10,*ppmVar11,
                               pmVar15->cert_profile,ssl->hostname,
                               &ssl->session_negotiate->verify_result,pmVar15->f_vrfy,
                               pmVar15->p_vrfy);
            if (iVar8 != 0) {
              mbedtls_debug_print_ret
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                         ,0x1101,"x509_verify_cert",iVar8);
            }
            pmVar10 = ssl->session_negotiate->peer_cert;
            iVar7 = mbedtls_pk_can_do(&pmVar10->pk,MBEDTLS_PK_ECKEY);
            pmVar15 = ssl->conf;
            if (iVar7 == 0) goto LAB_001703f9;
            pmVar12 = pmVar15->curve_list;
            if ((pmVar12 == (mbedtls_ecp_group_id *)0x0) ||
               (mVar14 = *pmVar12, mVar14 == MBEDTLS_ECP_DP_NONE)) goto LAB_001703ca;
            goto LAB_001703bc;
          }
          puVar5 = ssl->in_msg;
          if (puVar5[uVar9] != '\0') {
            pcVar16 = "bad certificate message";
            iVar7 = 0x10a7;
            goto LAB_001701dc;
          }
          uVar13 = *(ushort *)(puVar5 + uVar9 + 1) << 8 | *(ushort *)(puVar5 + uVar9 + 1) >> 8;
          if (uVar13 < 0x80) {
LAB_00170221:
            pcVar16 = "bad certificate message";
            iVar7 = 0x10b1;
            goto LAB_001701dc;
          }
          lVar18 = uVar9 + 3;
          uVar9 = (ulong)uVar13 + lVar18;
          if (ssl->in_hslen < uVar9) goto LAB_00170221;
          iVar7 = mbedtls_x509_crt_parse_der
                            (ssl->session_negotiate->peer_cert,puVar5 + lVar18,(ulong)uVar13);
        } while (iVar7 == 0);
        pcVar16 = " mbedtls_x509_crt_parse_der";
        iVar8 = 0x10b9;
        goto LAB_0016ff50;
      }
      pcVar16 = "bad certificate message";
      iVar7 = 0x108c;
      goto LAB_001701dc;
    }
  }
  pcVar16 = "bad certificate message";
  iVar7 = 0x107e;
LAB_001701dc:
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,iVar7,pcVar16);
  return -0x7a00;
  while (mVar14 = *pmVar12, mVar14 != MBEDTLS_ECP_DP_NONE) {
LAB_001703bc:
    pmVar12 = pmVar12 + 1;
    if (mVar14 == *(pmVar10->pk).pk_ctx) goto LAB_001703f9;
  }
LAB_001703ca:
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1110,"bad certificate (EC key curve)");
  if (iVar8 == 0) {
    iVar8 = -0x7a00;
  }
  pmVar15 = ssl->conf;
LAB_001703f9:
  iVar7 = mbedtls_ssl_check_cert_usage
                    (ssl->session_negotiate->peer_cert,ciphersuite,
                     ~*(uint *)&pmVar15->field_0x164 & 1,&ssl->session_negotiate->verify_result);
  if ((iVar7 != 0) &&
     (mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x111c,"bad certificate (usage extensions)"), iVar8 == 0)) {
    iVar8 = -0x7a00;
  }
  iVar7 = 0;
  if (uVar1 != 1) {
    iVar7 = iVar8;
  }
LAB_00170453:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1125,"<= parse certificate");
  return iVar7;
}

Assistant:

int mbedtls_ssl_parse_certificate( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, n;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    int authmode = ssl->conf->authmode;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if( ssl->handshake->sni_authmode != MBEDTLS_SSL_VERIFY_UNSET )
        authmode = ssl->handshake->sni_authmode;
#endif

    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
        authmode == MBEDTLS_SSL_VERIFY_NONE )
    {
        ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_SKIP_VERIFY;
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate" ) );
        ssl->state++;
        return( 0 );
    }
#endif

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    ssl->state++;

#if defined(MBEDTLS_SSL_SRV_C)
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    /*
     * Check if the client sent an empty certificate
     */
    if( ssl->conf->endpoint  == MBEDTLS_SSL_IS_SERVER &&
        ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( ssl->in_msglen  == 2                        &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_ALERT            &&
            ssl->in_msg[0]  == MBEDTLS_SSL_ALERT_LEVEL_WARNING  &&
            ssl->in_msg[1]  == MBEDTLS_SSL_ALERT_MSG_NO_CERT )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "SSLv3 client has no certificate" ) );

            ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;
            if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
                return( 0 );
            else
                return( MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_SSL3 */

#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->conf->endpoint  == MBEDTLS_SSL_IS_SERVER &&
        ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( ssl->in_hslen   == 3 + mbedtls_ssl_hs_hdr_len( ssl ) &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE    &&
            ssl->in_msg[0]  == MBEDTLS_SSL_HS_CERTIFICATE   &&
            memcmp( ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl ), "\0\0\0", 3 ) == 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLSv1 client has no certificate" ) );

            ssl->session_negotiate->verify_result = MBEDTLS_X509_BADCERT_MISSING;
            if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
                return( 0 );
            else
                return( MBEDTLS_ERR_SSL_NO_CLIENT_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
#endif /* MBEDTLS_SSL_SRV_C */

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_CERTIFICATE ||
        ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 3 + 3 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
    }

    i = mbedtls_ssl_hs_hdr_len( ssl );

    /*
     * Same message structure as in mbedtls_ssl_write_certificate()
     */
    n = ( ssl->in_msg[i+1] << 8 ) | ssl->in_msg[i+2];

    if( ssl->in_msg[i] != 0 ||
        ssl->in_hslen != n + 3 + mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
    }

    /* In case we tried to reuse a session but it failed */
    if( ssl->session_negotiate->peer_cert != NULL )
    {
        mbedtls_x509_crt_free( ssl->session_negotiate->peer_cert );
        mbedtls_free( ssl->session_negotiate->peer_cert );
    }

    if( ( ssl->session_negotiate->peer_cert = mbedtls_calloc( 1,
                    sizeof( mbedtls_x509_crt ) ) ) == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed",
                       sizeof( mbedtls_x509_crt ) ) );
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    mbedtls_x509_crt_init( ssl->session_negotiate->peer_cert );

    i += 3;

    while( i < ssl->in_hslen )
    {
        if( ssl->in_msg[i] != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        n = ( (unsigned int) ssl->in_msg[i + 1] << 8 )
            | (unsigned int) ssl->in_msg[i + 2];
        i += 3;

        if( n < 128 || i + n > ssl->in_hslen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        ret = mbedtls_x509_crt_parse_der( ssl->session_negotiate->peer_cert,
                                  ssl->in_msg + i, n );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, " mbedtls_x509_crt_parse_der", ret );
            return( ret );
        }

        i += n;
    }

    MBEDTLS_SSL_DEBUG_CRT( 3, "peer certificate", ssl->session_negotiate->peer_cert );

    /*
     * On client, make sure the server cert doesn't change during renego to
     * avoid "triple handshake" attack: https://secure-resumption.com/
     */
#if defined(MBEDTLS_SSL_RENEGOTIATION) && defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT &&
        ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
    {
        if( ssl->session->peer_cert == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "new server cert during renegotiation" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }

        if( ssl->session->peer_cert->raw.len !=
            ssl->session_negotiate->peer_cert->raw.len ||
            memcmp( ssl->session->peer_cert->raw.p,
                    ssl->session_negotiate->peer_cert->raw.p,
                    ssl->session->peer_cert->raw.len ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "server cert changed during renegotiation" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE );
        }
    }
#endif /* MBEDTLS_SSL_RENEGOTIATION && MBEDTLS_SSL_CLI_C */

    if( authmode != MBEDTLS_SSL_VERIFY_NONE )
    {
        mbedtls_x509_crt *ca_chain;
        mbedtls_x509_crl *ca_crl;

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
        if( ssl->handshake->sni_ca_chain != NULL )
        {
            ca_chain = ssl->handshake->sni_ca_chain;
            ca_crl   = ssl->handshake->sni_ca_crl;
        }
        else
#endif
        {
            ca_chain = ssl->conf->ca_chain;
            ca_crl   = ssl->conf->ca_crl;
        }

        if( ca_chain == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no CA chain" ) );
            return( MBEDTLS_ERR_SSL_CA_CHAIN_REQUIRED );
        }

        /*
         * Main check: verify certificate
         */
        ret = mbedtls_x509_crt_verify_with_profile(
                                ssl->session_negotiate->peer_cert,
                                ca_chain, ca_crl,
                                ssl->conf->cert_profile,
                                ssl->hostname,
                               &ssl->session_negotiate->verify_result,
                                ssl->conf->f_vrfy, ssl->conf->p_vrfy );

        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "x509_verify_cert", ret );
        }

        /*
         * Secondary checks: always done, but change 'ret' only if it was 0
         */

#if defined(MBEDTLS_ECP_C)
        {
            const mbedtls_pk_context *pk = &ssl->session_negotiate->peer_cert->pk;

            /* If certificate uses an EC key, make sure the curve is OK */
            if( mbedtls_pk_can_do( pk, MBEDTLS_PK_ECKEY ) &&
                mbedtls_ssl_check_curve( ssl, mbedtls_pk_ec( *pk )->grp.id ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate (EC key curve)" ) );
                if( ret == 0 )
                    ret = MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE;
            }
        }
#endif /* MBEDTLS_ECP_C */

        if( mbedtls_ssl_check_cert_usage( ssl->session_negotiate->peer_cert,
                                  ciphersuite_info,
                                  ! ssl->conf->endpoint,
                                 &ssl->session_negotiate->verify_result ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate (usage extensions)" ) );
            if( ret == 0 )
                ret = MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE;
        }

        if( authmode == MBEDTLS_SSL_VERIFY_OPTIONAL )
            ret = 0;
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate" ) );

    return( ret );
}